

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::io::anon_unknown_0::PrinterTest_EmitWithIndent_Test::TestBody
          (PrinterTest_EmitWithIndent_Test *this)

{
  ZeroCopyOutputStream *output;
  long lVar1;
  char *message;
  allocator<char> local_3f2;
  allocator<char> local_3f1;
  AssertHelper local_3f0;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  Printer printer;
  AssertionResult gtest_ar;
  Sub local_1a0;
  Sub local_e8;
  
  output = PrinterTest::output(&this->super_PrinterTest);
  Printer::Printer(&printer,output);
  printer.indent_ = printer.indent_ + printer.options_.spaces_per_indent;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3a8,"f1",(allocator<char> *)&local_3f0);
  Printer::Sub::Sub<char_const(&)[2]>
            ((Sub *)&gtest_ar,&local_3a8,(char (*) [2])(anon_var_dwarf_b01a6c + 8));
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"f2",&local_3f1);
  Printer::Sub::Sub<char_const(&)[2]>(&local_1a0,&local_3c8,(char (*) [2])0x113ff44);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e8,"f3",&local_3f2);
  Printer::Sub::Sub<char_const(&)[2]>(&local_e8,&local_3e8,(char (*) [2])0xef94d2);
  Printer::Emit(&printer,&gtest_ar,3,0x3e,
                "\n      class Foo {\n        int $f1$, $f2$, $f3$;\n      };\n    ");
  lVar1 = 0x170;
  do {
    Printer::Sub::~Sub((Sub *)(&gtest_ar.success_ + lVar1));
    lVar1 = lVar1 + -0xb8;
  } while (lVar1 != -0xb8);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)&local_3a8);
  printer.indent_ = printer.indent_ - printer.options_.spaces_per_indent;
  Printer::~Printer(&printer);
  if ((this->super_PrinterTest).stream_.
      super__Optional_base<google::protobuf::io::StringOutputStream,_false,_false>._M_payload.
      super__Optional_payload<google::protobuf::io::StringOutputStream,_true,_false,_false>.
      super__Optional_payload_base<google::protobuf::io::StringOutputStream>._M_engaged == true) {
    (this->super_PrinterTest).stream_.
    super__Optional_base<google::protobuf::io::StringOutputStream,_false,_false>._M_payload.
    super__Optional_payload<google::protobuf::io::StringOutputStream,_true,_false,_false>.
    super__Optional_payload_base<google::protobuf::io::StringOutputStream>._M_engaged = false;
  }
  printer.sink_.buffer_ = (this->super_PrinterTest).out_._M_dataplus._M_p;
  printer.sink_.stream_ = (ZeroCopyOutputStream *)(this->super_PrinterTest).out_._M_string_length;
  testing::internal::CmpHelperEQ<std::basic_string_view<char,std::char_traits<char>>,char[37]>
            ((internal *)&gtest_ar,"written()",
             "\"  class Foo {\\n\" \"    int x, y, z;\\n\" \"  };\\n\"",
             (basic_string_view<char,_std::char_traits<char>_> *)&printer,
             (char (*) [37])"  class Foo {\n    int x, y, z;\n  };\n");
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&printer);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = anon_var_dwarf_651463 + 5;
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer_unittest.cc"
               ,0x2c9,message);
    testing::internal::AssertHelper::operator=(&local_3f0,(Message *)&printer);
    testing::internal::AssertHelper::~AssertHelper(&local_3f0);
    if (printer.sink_.stream_ != (ZeroCopyOutputStream *)0x0) {
      (*(printer.sink_.stream_)->_vptr_ZeroCopyOutputStream[1])();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(PrinterTest, EmitWithIndent) {
  {
    Printer printer(output());
    auto v = printer.WithIndent();
    printer.Emit({{"f1", "x"}, {"f2", "y"}, {"f3", "z"}}, R"cc(
      class Foo {
        int $f1$, $f2$, $f3$;
      };
    )cc");
  }

  EXPECT_EQ(written(),
            "  class Foo {\n"
            "    int x, y, z;\n"
            "  };\n");
}